

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobian
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixView<double> *outJacobian)

{
  index_type iVar1;
  long lVar2;
  MatrixView<double> *in_RCX;
  MatrixView<double> *in_RDX;
  MatrixView<double> *in_RSI;
  bool bVar3;
  FrameIndex expressedOrientationFrame;
  FrameIndex expressedOriginFrame;
  bool ok;
  MatrixView<double> *in_stack_00000280;
  FrameIndex in_stack_00000288;
  FrameIndex in_stack_00000290;
  FrameIndex in_stack_00000298;
  FrameIndex in_stack_000002a0;
  KinDynComputations *in_stack_000002a8;
  bool local_1;
  
  iVar1 = MatrixView<double>::rows(in_RCX);
  bVar3 = false;
  if (iVar1 == 6) {
    iVar1 = MatrixView<double>::cols(in_RCX);
    lVar2 = iDynTree::Model::getNrOfDOFs();
    bVar3 = iVar1 == lVar2;
  }
  if (bVar3) {
    MatrixView<double>::MatrixView(in_RDX,in_RSI);
    local_1 = getRelativeJacobianExplicit
                        (in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000290,
                         in_stack_00000288,in_stack_00000280);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getRelativeJacobian","Wrong size in input outJacobian");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool KinDynComputations::getRelativeJacobian(const iDynTree::FrameIndex refFrameIndex,
                                             const iDynTree::FrameIndex frameIndex,
                                             MatrixView<double> outJacobian)
{

    bool ok = (outJacobian.rows() == 6)
        && (outJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs());

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getRelativeJacobian",
                    "Wrong size in input outJacobian");
        return false;
    }

    iDynTree::FrameIndex expressedOriginFrame = iDynTree::FRAME_INVALID_INDEX;
    iDynTree::FrameIndex expressedOrientationFrame = iDynTree::FRAME_INVALID_INDEX;

    if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
        //left trivialized: we want to expressed the information wrt child frame
        expressedOriginFrame = expressedOrientationFrame = frameIndex;

    } else if (pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION) {
        //right trivialized: we want to expressed the information wrt parent frame
        expressedOriginFrame = expressedOrientationFrame = refFrameIndex;
    } else if (pimpl->m_frameVelRepr == MIXED_REPRESENTATION) {
        //Mixed representation: origin as child, orientation as parent
        expressedOriginFrame = frameIndex;
        expressedOrientationFrame = refFrameIndex;
    }

    return getRelativeJacobianExplicit(refFrameIndex, frameIndex, expressedOriginFrame, expressedOrientationFrame, outJacobian);
}